

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_props
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   *props,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *tok_table,
                   vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames,
                   uint32_t indent)

{
  pointer pTVar1;
  size_type sVar2;
  const_iterator cVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  pointer pTVar6;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pTVar6 = (propNames->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (propNames->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar6) {
    print_props(&local_1d8,props,indent);
    ::std::operator<<(local_1a8,(string *)&local_1d8);
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    lVar5 = 0;
    for (uVar4 = 0; uVar4 < (ulong)((long)pTVar1 - (long)pTVar6 >> 5); uVar4 = uVar4 + 1) {
      sVar2 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(tok_table,(key_type *)((long)&(pTVar6->str_)._M_dataplus._M_p + lVar5));
      if (sVar2 == 0) {
        cVar3 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        *)props,(key_type *)
                                ((long)&(((propNames->
                                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->str_).
                                        _M_dataplus._M_p + lVar5));
        if ((_Rb_tree_header *)cVar3._M_node != &(props->_M_t)._M_impl.super__Rb_tree_header) {
          print_prop(&local_1d8,(Property *)(cVar3._M_node + 2),(string *)(cVar3._M_node + 1),indent
                    );
          ::std::operator<<(local_1a8,(string *)&local_1d8);
          ::std::__cxx11::string::_M_dispose();
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)tok_table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((propNames->
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               )._M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p +
                     lVar5));
        }
      }
      pTVar6 = (propNames->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (propNames->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0x20;
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_props(const std::map<std::string, Property> &props,
                        std::set<std::string> &tok_table,
                        const std::vector<value::token> &propNames,
                        uint32_t indent) {
  std::stringstream ss;

  if (propNames.size()) {
    for (size_t i = 0; i < propNames.size(); i++) {
      if (tok_table.count(propNames[i].str())) {
        continue;
      }

      const auto it = props.find(propNames[i].str());
      if (it != props.end()) {
        ss << print_prop(it->second, it->first, indent);

        tok_table.insert(propNames[i].str());
      }
    }
  } else {
    ss << print_props(props, indent);
  }

  return ss.str();
}